

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void vrna_md_set_nonstandards(vrna_md_t *md,char *ns_bases)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  
  if (md == (vrna_md_t *)0x0) {
    return;
  }
  if (ns_bases == (char *)0x0) {
    md->nonstandards[0] = '\0';
    free(nonstandards);
    nonstandards = (char *)0x0;
  }
  else {
    sVar7 = strlen(ns_bases);
    if ((uint)sVar7 < 0x21) {
      cVar2 = *ns_bases;
      pcVar10 = ns_bases + (cVar2 == '-');
      pcVar1 = md->nonstandards;
      uVar9 = 0;
      do {
        cVar3 = *pcVar10;
        pcVar11 = pcVar10;
        if (cVar3 != ',') {
          iVar8 = (int)uVar9;
          lVar12 = (long)iVar8;
          if (cVar3 == '\0') goto LAB_00124898;
          pcVar11 = pcVar10 + 1;
          uVar9 = lVar12 + 2;
          pcVar1[lVar12] = cVar3;
          cVar3 = pcVar10[1];
          md->nonstandards[lVar12 + 1] = cVar3;
          if ((cVar2 == '-') && (cVar3 != *pcVar10)) {
            pcVar1[uVar9] = cVar3;
            uVar9 = (ulong)(iVar8 + 4);
            pcVar1[lVar12 + 3] = *pcVar10;
          }
        }
        pcVar10 = pcVar11 + 1;
      } while( true );
    }
    vrna_message_warning("vrna_md_set_nonstandards: list too long, dropping nonstandards!");
  }
LAB_001248cf:
  vrna_md_update(md);
  return;
LAB_00124898:
  pcVar1[lVar12] = '\0';
  free(nonstandards);
  pcVar10 = (char *)vrna_alloc(0x21);
  uVar4 = *(undefined8 *)(md->nonstandards + 8);
  uVar5 = *(undefined8 *)(md->nonstandards + 0x10);
  uVar6 = *(undefined8 *)(md->nonstandards + 0x18);
  nonstandards = pcVar10;
  *(undefined8 *)pcVar10 = *(undefined8 *)pcVar1;
  *(undefined8 *)(pcVar10 + 8) = uVar4;
  *(undefined8 *)(pcVar10 + 0x10) = uVar5;
  *(undefined8 *)(pcVar10 + 0x18) = uVar6;
  pcVar10[0x20] = md->nonstandards[0x20];
  goto LAB_001248cf;
}

Assistant:

PUBLIC void
vrna_md_set_nonstandards(vrna_md_t  *md,
                         const char *ns_bases)
{
  const char    *c;
  unsigned int  n;
  int           i, sym;

  if (md) {
    if (ns_bases) {
      n = strlen(ns_bases);
      if (n < 33) {
        /* parse the ns_bases list */
        c = ns_bases;
        i = sym = 0;
        if (*c == '-') {
          sym = 1;
          c++;
        }

        while (*c != '\0') {
          if (*c != ',') {
            md->nonstandards[i++] = *c++;
            md->nonstandards[i++] = *c;
            if ((sym) && (*c != *(c - 1))) {
              md->nonstandards[i++] = *c;
              md->nonstandards[i++] = *(c - 1);
            }
          }

          c++;
        }
        md->nonstandards[i] = '\0';

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
        free(nonstandards);
        nonstandards = vrna_alloc(33);
        memcpy(nonstandards, &(md->nonstandards[0]), 33 * sizeof(char));
#endif
      } else {
        vrna_message_warning("vrna_md_set_nonstandards: list too long, dropping nonstandards!");
      }
    } else {
      /* remove nonstandards */
      md->nonstandards[0] = '\0';
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
      free(nonstandards);
      nonstandards = NULL;
#endif
    }

    /* update pair/rtype/alias arrays accordingly */
    vrna_md_update(md);
  }
}